

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O0

int av1_palette_color_cost_uv
              (PALETTE_MODE_INFO *pmi,uint16_t *color_cache,int n_cache,int bit_depth)

{
  uint n_colors;
  int iVar1;
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  uint16_t *in_RDI;
  int bits_using_raw;
  int bits_using_delta;
  int bits_v;
  int min_bits_v;
  int zero_count;
  int n_out_cache;
  uint8_t cache_color_found [16];
  int out_cache_colors [8];
  int total_bits;
  int n;
  int local_78;
  int *in_stack_ffffffffffffffa8;
  int *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffbc;
  PALETTE_MODE_INFO *in_stack_ffffffffffffffc0;
  int *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int iVar2;
  
  n_colors = (uint)*(byte *)((long)in_RDI + 0x31);
  iVar2 = 0;
  av1_index_color_cache
            (in_RDI,(int)((ulong)in_RSI >> 0x20),(uint16_t *)CONCAT44(in_EDX,in_ECX),n_colors,
             (uint8_t *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             in_stack_ffffffffffffffd0);
  iVar1 = delta_encode_cost((int *)CONCAT44(in_EDX,in_ECX),n_colors,iVar2,in_stack_ffffffffffffffdc)
  ;
  iVar2 = in_EDX + iVar1 + iVar2;
  iVar1 = av1_get_palette_delta_bits_v
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,
                     in_stack_ffffffffffffffa8);
  iVar1 = in_ECX + 2 + (iVar1 + 1) * (n_colors - 1);
  local_78 = in_ECX * n_colors;
  if (iVar1 < local_78) {
    local_78 = iVar1;
  }
  return (local_78 + 1 + iVar2) * 0x200;
}

Assistant:

int av1_palette_color_cost_uv(const PALETTE_MODE_INFO *const pmi,
                              const uint16_t *color_cache, int n_cache,
                              int bit_depth) {
  const int n = pmi->palette_size[1];
  int total_bits = 0;
  // U channel palette color cost.
  int out_cache_colors[PALETTE_MAX_SIZE];
  uint8_t cache_color_found[2 * PALETTE_MAX_SIZE];
  const int n_out_cache = av1_index_color_cache(
      color_cache, n_cache, pmi->palette_colors + PALETTE_MAX_SIZE, n,
      cache_color_found, out_cache_colors);
  total_bits +=
      n_cache + delta_encode_cost(out_cache_colors, n_out_cache, bit_depth, 0);

  // V channel palette color cost.
  int zero_count = 0, min_bits_v = 0;
  const int bits_v =
      av1_get_palette_delta_bits_v(pmi, bit_depth, &zero_count, &min_bits_v);
  const int bits_using_delta =
      2 + bit_depth + (bits_v + 1) * (n - 1) - zero_count;
  const int bits_using_raw = bit_depth * n;
  total_bits += 1 + AOMMIN(bits_using_delta, bits_using_raw);
  return av1_cost_literal(total_bits);
}